

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O0

SetInfluences * __thiscall
wasm::LazyLocalGraph::getSetInfluences(LazyLocalGraph *this,LocalSet *set)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
  local_38;
  _Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
  local_20;
  iterator iter;
  LocalSet *set_local;
  LazyLocalGraph *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
               )set;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
       ::find(&this->setInfluences,(key_type *)&iter);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
       ::end(&this->setInfluences);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (bVar1) {
    computeSetInfluences
              (this,(LocalSet *)
                    iter.
                    super__Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
                    ._M_cur);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
         ::find(&this->setInfluences,(key_type *)&iter);
    local_20._M_cur = local_30._M_cur;
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
         ::end(&this->setInfluences);
    bVar1 = std::__detail::operator!=(&local_20,&local_38);
    if (!bVar1) {
      __assert_fail("iter != setInfluences.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/local-graph.h"
                    ,0xcd,
                    "const SetInfluences &wasm::LazyLocalGraph::getSetInfluences(LocalSet *) const")
      ;
    }
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false,_false>
                         *)&local_20);
  return &ppVar2->second;
}

Assistant:

const SetInfluences& getSetInfluences(LocalSet* set) const {
    auto iter = setInfluences.find(set);
    if (iter == setInfluences.end()) {
      computeSetInfluences(set);
      iter = setInfluences.find(set);
      assert(iter != setInfluences.end());
    }
    return iter->second;
  }